

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_fileio.cpp
# Opt level: O2

Result_t *
Kumu::ReadFileIntoBuffer
          (Result_t *__return_storage_ptr__,string *Filename,ByteString *Buffer,ui32_t param_3)

{
  fsize_t fVar1;
  byte_t *buf;
  ui32_t cap_size;
  ui32_t read_count;
  FileReader Reader;
  Result_t result;
  ui32_t local_12c;
  FileReader local_128;
  Result_t local_f8;
  Result_t local_90;
  
  fVar1 = FileSize(Filename);
  cap_size = (ui32_t)fVar1;
  ByteString::Capacity(&local_90,Buffer,cap_size);
  if (-1 < local_90.value) {
    local_12c = 0;
    FileReader::FileReader(&local_128);
    FileReader::OpenRead(&local_f8,&local_128,Filename);
    Result_t::operator=(&local_90,&local_f8);
    Result_t::~Result_t(&local_f8);
    if (-1 < local_90.value) {
      buf = ByteString::Data(Buffer);
      FileReader::Read(&local_f8,&local_128,buf,cap_size,&local_12c);
      Result_t::operator=(&local_90,&local_f8);
      Result_t::~Result_t(&local_f8);
      if (-1 < local_90.value) {
        if (local_12c != cap_size) {
          Result_t::Result_t(__return_storage_ptr__,(Result_t *)RESULT_READFAIL);
          FileReader::~FileReader(&local_128);
          goto LAB_00114194;
        }
        Buffer->m_Length = cap_size;
      }
    }
    FileReader::~FileReader(&local_128);
  }
  Result_t::Result_t(__return_storage_ptr__,&local_90);
LAB_00114194:
  Result_t::~Result_t(&local_90);
  return __return_storage_ptr__;
}

Assistant:

Result_t
Kumu::ReadFileIntoBuffer(const std::string& Filename, Kumu::ByteString& Buffer, ui32_t)
{
  ui32_t file_size = FileSize(Filename);
  Result_t result = Buffer.Capacity(file_size);

  if ( KM_SUCCESS(result) )
    {
      ui32_t read_count = 0;
      FileReader Reader;

      result = Reader.OpenRead(Filename);

      if ( KM_SUCCESS(result) )
	result = Reader.Read(Buffer.Data(), file_size, &read_count);
    
      if ( KM_SUCCESS(result) )
	{
	  if ( file_size != read_count) 
	    return RESULT_READFAIL;

	  Buffer.Length(read_count);
	}
    }
  
  return result;
}